

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O3

void * lws_protocol_vh_priv_get(lws_vhost *vhost,lws_protocols *prot)

{
  int iVar1;
  void **ppvVar2;
  char *__s2;
  ulong uVar3;
  int iVar4;
  lws_protocols *plVar5;
  ulong uVar6;
  lws_protocols *plVar7;
  void *pvVar8;
  bool bVar9;
  
  if ((((vhost == (lws_vhost *)0x0) || (plVar7 = vhost->protocols, plVar7 == (lws_protocols *)0x0))
      || (ppvVar2 = vhost->protocol_vh_privs,
         prot == (lws_protocols *)0x0 || ppvVar2 == (void **)0x0)) ||
     (__s2 = prot->name, __s2 == (char *)0x0)) {
    return (void *)0x0;
  }
  iVar1 = vhost->count_protocols;
  plVar5 = plVar7;
  uVar3 = 0;
  do {
    uVar6 = uVar3;
    if ((long)iVar1 <= (long)uVar6) break;
    bVar9 = plVar5 != prot;
    plVar5 = plVar5 + 1;
    uVar3 = uVar6 + 1;
  } while (bVar9);
  if (iVar1 + 1 == (int)(uVar6 + 1)) {
    if (iVar1 < 1) {
      uVar6 = 0;
LAB_00114275:
      if ((int)uVar6 != iVar1) goto LAB_001142ad;
    }
    else {
      uVar6 = 0;
      do {
        if ((plVar7->name != (char *)0x0) && (iVar4 = strcmp(plVar7->name,__s2), iVar4 == 0))
        goto LAB_00114275;
        uVar6 = uVar6 + 1;
        plVar7 = plVar7 + 1;
      } while ((long)iVar1 != uVar6);
    }
    pvVar8 = (void *)0x0;
    _lws_log_cx((vhost->lc).log_cx,lws_log_prepend_vhost,vhost,1,"lws_protocol_vh_priv_get",
                "unknown protocol %p",prot);
  }
  else {
LAB_001142ad:
    pvVar8 = ppvVar2[uVar6 & 0xffffffff];
  }
  return pvVar8;
}

Assistant:

void *
lws_protocol_vh_priv_get(struct lws_vhost *vhost,
			 const struct lws_protocols *prot)
{
	int n = 0;

	if (!vhost || !vhost->protocols ||
	    !vhost->protocol_vh_privs || !prot || !prot->name)
		return NULL;

	while (n < vhost->count_protocols && &vhost->protocols[n] != prot)
		n++;

	if (n == vhost->count_protocols) {
		n = 0;
		while (n < vhost->count_protocols) {
			if (vhost->protocols[n].name &&
			    !strcmp(vhost->protocols[n].name, prot->name))
				break;
			n++;
		}

		if (n == vhost->count_protocols) {
			lwsl_vhost_err(vhost, "unknown protocol %p", prot);
			return NULL;
		}
	}

	return vhost->protocol_vh_privs[n];
}